

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

bool duckdb::DoubleToVarInt<float>(float double_value,string_t *result_value,Vector *result)

{
  double dVar1;
  reference pvVar2;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t len;
  long lVar3;
  ulong uVar4;
  char *__n;
  char *blob;
  uint uVar5;
  anon_struct_16_3_d7536bce_for_pointer aVar6;
  vector<char,_true> value;
  byte local_79;
  vector<char,_std::allocator<char>_> local_78;
  anon_union_16_2_67f50693_for_value *local_60;
  char *local_58;
  double local_50;
  float local_48;
  
  if ((uint)ABS(double_value) < 0x7f800000) {
    local_60 = &result_value->value;
    if ((double_value != 0.0) || (NAN(double_value))) {
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (char *)0x0;
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (char *)0x0;
      dVar1 = (double)ABS(double_value);
      local_48 = double_value;
      do {
        local_58 = (char *)dVar1;
        local_50 = floor(dVar1 * 0.00390625);
        local_79 = (byte)(int)(local_50 * -256.0 + (double)local_58);
        if (0.0 <= local_48) {
          if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_012e8eef;
          ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(char *)&local_79);
          len = extraout_RDX_01;
        }
        else {
          local_79 = ~local_79;
          if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char *)&local_79);
            len = extraout_RDX_00;
          }
          else {
LAB_012e8eef:
            *local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_79;
            local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
            len = extraout_RDX;
          }
        }
        dVar1 = local_50;
      } while (0.0 < local_50);
      uVar4 = (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar5 = (int)uVar4 + 3;
      aVar6 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::EmptyString((StringVector *)result,(Vector *)(ulong)uVar5,len);
      local_60->pointer = aVar6;
      local_58 = (local_60->pointer).prefix;
      blob = aVar6.ptr;
      if (aVar6.length < 0xd) {
        blob = local_58;
      }
      Varint::SetHeader(blob,uVar4 & 0xffffffff,local_48 < 0.0);
      if (3 < uVar5) {
        __n = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              ~(ulong)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar3 = 3;
        do {
          pvVar2 = vector<char,_true>::operator[]((vector<char,_true> *)&local_78,(size_type)__n);
          blob[lVar3] = *pvVar2;
          lVar3 = lVar3 + 1;
          __n = __n + -1;
        } while ((Vector *)(ulong)uVar5 != (Vector *)lVar3);
      }
      uVar4 = (ulong)(((anon_union_16_2_67f50693_for_value *)&(local_60->pointer).length)->pointer).
                     length;
      if (uVar4 < 0xd) {
        switchD_010444a0::default(local_58 + uVar4,0,0xc - uVar4);
      }
      else {
        *(undefined4 *)(local_60->pointer).prefix = *(undefined4 *)(local_60->pointer).ptr;
      }
      if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      aVar6 = (anon_struct_16_3_d7536bce_for_pointer)Varint::InitializeVarintZero(result);
      local_60->pointer = aVar6;
    }
  }
  return (uint)ABS(double_value) < 0x7f800000;
}

Assistant:

bool DoubleToVarInt(T double_value, string_t &result_value, Vector &result) {
	// Check if we can cast it
	if (!std::isfinite(double_value)) {
		// We can't cast inf -inf nan
		return false;
	}
	// Determine if the number is negative
	bool is_negative = double_value < 0;
	// Determine the number of data bytes
	double abs_value = std::abs(double_value);

	if (abs_value == 0) {
		// Return Value 0
		result_value = Varint::InitializeVarintZero(result);
		return true;
	}
	vector<char> value;
	while (abs_value > 0) {
		double quotient = abs_value / 256;
		double truncated = floor(quotient);
		uint8_t byte = static_cast<uint8_t>(abs_value - truncated * 256);
		abs_value = truncated;
		if (is_negative) {
			value.push_back(static_cast<char>(~byte));
		} else {
			value.push_back(static_cast<char>(byte));
		}
	}
	uint32_t data_byte_size = static_cast<uint32_t>(value.size());
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	result_value = StringVector::EmptyString(result, blob_size);
	auto writable_blob = result_value.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);
	// Add data bytes to the blob, starting off after header bytes
	idx_t blob_string_idx = value.size() - 1;
	for (idx_t i = Varint::VARINT_HEADER_SIZE; i < blob_size; i++) {
		writable_blob[i] = value[blob_string_idx--];
	}
	result_value.Finalize();
	return true;
}